

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.cpp
# Opt level: O1

CSipHasher * __thiscall CSipHasher::Write(CSipHasher *this,Span<const_unsigned_char> data)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t uVar9;
  ulong uVar10;
  uint64_t uVar11;
  byte bVar12;
  size_t sVar13;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = this->v[0];
  uVar6 = this->v[1];
  uVar11 = this->v[2];
  uVar9 = this->v[3];
  uVar3 = this->tmp;
  bVar12 = this->count;
  if (data.m_size != 0) {
    bVar4 = bVar12 * '\b';
    sVar13 = 0;
    do {
      uVar3 = (ulong)data.m_data[sVar13] << (bVar4 & 0x38) | uVar3;
      if (((bVar12 + 1 & 0xff) + (int)sVar13 & 7) == 0) {
        uVar2 = uVar2 + uVar6;
        uVar5 = (uVar6 << 0xd | uVar6 >> 0x33) ^ uVar2;
        uVar7 = uVar9 ^ uVar3;
        uVar8 = (uVar7 << 0x10 | uVar7 >> 0x30) ^ uVar11 + uVar7;
        uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar8;
        uVar10 = uVar11 + uVar7 + uVar5;
        uVar5 = (uVar5 << 0x11 | uVar5 >> 0x2f) ^ uVar10;
        uVar7 = (uVar8 << 0x15 | uVar8 >> 0x2b) ^ uVar2;
        uVar2 = uVar2 + uVar5;
        uVar5 = (uVar5 << 0xd | uVar5 >> 0x33) ^ uVar2;
        uVar8 = (uVar10 << 0x20 | uVar10 >> 0x20) + uVar7;
        uVar7 = (uVar7 << 0x10 | uVar7 >> 0x30) ^ uVar8;
        uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar7;
        uVar9 = (uVar7 << 0x15 | uVar7 >> 0x2b) ^ uVar2;
        uVar8 = uVar8 + uVar5;
        uVar6 = (uVar5 << 0x11 | uVar5 >> 0x2f) ^ uVar8;
        uVar11 = uVar8 << 0x20 | uVar8 >> 0x20;
        uVar2 = uVar2 ^ uVar3;
        uVar3 = 0;
      }
      sVar13 = sVar13 + 1;
      bVar4 = bVar4 + 8;
    } while (data.m_size != sVar13);
    bVar12 = bVar12 + (char)data.m_size;
  }
  this->v[0] = uVar2;
  this->v[1] = uVar6;
  this->v[2] = uVar11;
  this->v[3] = uVar9;
  this->count = bVar12;
  this->tmp = uVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

CSipHasher& CSipHasher::Write(Span<const unsigned char> data)
{
    uint64_t v0 = v[0], v1 = v[1], v2 = v[2], v3 = v[3];
    uint64_t t = tmp;
    uint8_t c = count;

    while (data.size() > 0) {
        t |= uint64_t{data.front()} << (8 * (c % 8));
        c++;
        if ((c & 7) == 0) {
            v3 ^= t;
            SIPROUND;
            SIPROUND;
            v0 ^= t;
            t = 0;
        }
        data = data.subspan(1);
    }

    v[0] = v0;
    v[1] = v1;
    v[2] = v2;
    v[3] = v3;
    count = c;
    tmp = t;

    return *this;
}